

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmfilobj.cpp
# Opt level: O3

CVmNetFile *
CVmObjFile::get_filename_arg
          (vm_val_t *arg,vm_rcdesc *rc,int access,int is_resource_file,os_filetype_t file_type,
          char *mime_type)

{
  long lVar1;
  void *pvVar2;
  int iVar3;
  char *str;
  CVmNetFile *nf;
  undefined4 extraout_var;
  uint mode;
  long *in_FS_OFFSET;
  char fname [4096];
  uint local_1028 [2];
  long local_1020;
  void *local_1018;
  __jmp_buf_tag local_1010 [20];
  
  if (access - 0x1001U < 6) {
    mode = 0;
  }
  else {
    mode = access;
    switch(access) {
    case 1:
      break;
    case 2:
      mode = 0xe;
      break;
    case 3:
      mode = 7;
      break;
    case 4:
      mode = 0xf;
      break;
    default:
      if (access != 0x1000) {
        err_throw(0x902);
      }
      mode = 0x10;
    }
  }
  if (is_resource_file == 0) {
    iVar3 = CVmNetFile::open((char *)arg,(int)rc,(ulong)mode,file_type,mime_type);
    nf = (CVmNetFile *)CONCAT44(extraout_var,iVar3);
    G_err_frame::__tls_init();
    local_1020 = *in_FS_OFFSET;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = (long)local_1028;
    local_1028[0] = _setjmp(local_1010);
    if (local_1028[0] == 0) {
      check_safety_for_open(nf,access);
    }
    if (local_1028[0] == 1) {
      local_1028[0] = 2;
      CVmNetFile::abandon(nf);
      err_rethrow();
    }
    lVar1 = local_1020;
    G_err_frame::__tls_init();
    *in_FS_OFFSET = lVar1;
    if ((local_1028[0] & 0x4001) != 0) {
      G_err_frame::__tls_init();
      if ((*(byte *)*in_FS_OFFSET & 2) != 0) {
        G_err_frame::__tls_init();
        free(*(void **)(*in_FS_OFFSET + 0x10));
      }
      pvVar2 = local_1018;
      G_err_frame::__tls_init();
      *(void **)(*in_FS_OFFSET + 0x10) = pvVar2;
      err_rethrow();
    }
    if ((local_1028[0] & 2) != 0) {
      free(local_1018);
    }
  }
  else {
    str = CVmBif::get_str_val(arg);
    CVmBif::get_str_val_fname((char *)local_1028,0x1000,str);
    nf = CVmNetFile::open_local((char *)local_1028,0,mode,file_type);
  }
  return nf;
}

Assistant:

CVmNetFile *CVmObjFile::get_filename_arg(
    VMG_ const vm_val_t *arg, const vm_rcdesc *rc,
    int access, int is_resource_file,
    os_filetype_t file_type, const char *mime_type)
{
    /* figure the network file access mode */
    int nmode;
    switch (access)
    {
    case VMOBJFILE_ACCESS_READ:
        /* read access; file must exist */
        nmode = NETF_READ;
        break;

    case VMOBJFILE_ACCESS_WRITE:
        /* write access; create or replace existing file */ 
        nmode = NETF_WRITE | NETF_CREATE | NETF_TRUNC;
        break;

    case VMOBJFILE_ACCESS_RW_KEEP:
        /* read/write access; keep an existing file or create a new one */
        nmode = NETF_READ | NETF_WRITE | NETF_CREATE;
        break;

    case VMOBJFILE_ACCESS_RW_TRUNC:
        /* read/write access; truncate an existing file or create a new one */
        nmode = NETF_READ | NETF_WRITE | NETF_CREATE | NETF_TRUNC;
        break;

    case VMOBJFILE_ACCESS_DELETE:
        /* delete mode */
        nmode = NETF_DELETE;
        break;

    case VMOBJFILE_ACCESS_GETINFO:
    case VMOBJFILE_ACCESS_MKDIR:
    case VMOBJFILE_ACCESS_RMDIR:
    case VMOBJFILE_ACCESS_READDIR:
    case VMOBJFILE_ACCESS_RENAME_TO:
    case VMOBJFILE_ACCESS_RENAME_FROM:
        /* 
         *   getFileType/getFileInfo/rename/directory manipulation - we don't
         *   need to open the file at all for these operations
         */
        nmode = 0;
        break;

    default:
        /* invalid mode */
        err_throw(VMERR_BAD_VAL_BIF);
    }

    /* we don't have a network file descriptor yet */
    CVmNetFile *netfile = 0;
    char fname[OSFNMAX];

    /* check to see what kind of file spec we have */
    if (is_resource_file)
    {
        /* a resource file must be given as a string name - retrieve it */
        CVmBif::get_str_val_fname(vmg_ fname, sizeof(fname),
                                  CVmBif::get_str_val(vmg_ arg));

        /* resources are always local, so create a local file descriptor */
        netfile = CVmNetFile::open_local(vmg_ fname, 0, nmode, file_type);
    }
    else
    {
        /* regular file - create the network file descriptor */
        netfile = CVmNetFile::open(
            vmg_ arg, rc, nmode, file_type, mime_type);
    }
    
    /* 
     *   If this isn't a resource file, check the file safety mode to see if
     *   the operation is allowed.  Reading resources is always allowed,
     *   regardless of the safety mode, since resources are read-only and are
     *   inherently constrained in the paths they can access.  
     */
    if (!is_resource_file)
    {
        err_try
        {
            check_safety_for_open(vmg_ netfile, access);
        }
        err_catch_disc
        {
            /* abandon the net file descriptor and bubble up the error */
            netfile->abandon(vmg0_);
            err_rethrow();
        }